

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTcpIpLink.cpp
# Opt level: O0

void xe::TcpIpLink::keepaliveTimerCallback(void *ptr)

{
  deUint64 dVar1;
  deUint64 dVar2;
  BlockBuffer<unsigned_char> *dst;
  CanceledException *anon_var_0;
  deUint64 curTime;
  deUint64 lastKeepalive;
  TcpIpLink *link;
  void *ptr_local;
  
  dVar1 = TcpIpLinkState::getLastKeepaliveRecevied((TcpIpLinkState *)((long)ptr + 0x10));
  dVar2 = deGetMicroseconds();
  if (30000000 < (long)(dVar2 - dVar1)) {
    TcpIpLinkState::setState
              ((TcpIpLinkState *)((long)ptr + 0x10),COMMLINKSTATE_ERROR,"Keepalive timeout");
  }
  dst = TcpIpSendThread::getBuffer((TcpIpSendThread *)((long)ptr + 0x68));
  writeKeepalive(dst);
  return;
}

Assistant:

void TcpIpLink::keepaliveTimerCallback (void* ptr)
{
	TcpIpLink*	link			= static_cast<TcpIpLink*>(ptr);
	deUint64	lastKeepalive	= link->m_state.getLastKeepaliveRecevied();
	deUint64	curTime			= deGetMicroseconds();

	// Check for timeout.
	if ((deInt64)curTime-(deInt64)lastKeepalive > xs::KEEPALIVE_TIMEOUT*1000)
		link->m_state.setState(COMMLINKSTATE_ERROR, "Keepalive timeout");

	// Enqueue new keepalive.
	try
	{
		writeKeepalive(link->m_sendThread.getBuffer());
	}
	catch (const de::BlockBuffer<deUint8>::CanceledException&)
	{
		// Ignore. Can happen in connection teardown.
	}
}